

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

void float_to_s24(void *ptr,long nsamp,float volume)

{
  long lVar1;
  long in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  int s;
  float mult;
  float *src;
  int32_t *dst;
  float local_30;
  float *local_28;
  float *local_20;
  long local_10;
  
  local_28 = in_RDI;
  local_20 = in_RDI;
  local_10 = in_RSI;
  while (0 < local_10) {
    lVar1 = lrintf(*local_28 * in_XMM0_Da * 8388608.0);
    local_30 = (float)lVar1;
    if ((int)local_30 < -0x800000) {
      local_30 = -INFINITY;
    }
    else if (0x7fffff < (int)local_30) {
      local_30 = 1.1754942e-38;
    }
    *local_20 = local_30;
    local_28 = local_28 + 1;
    local_20 = local_20 + 1;
    local_10 = local_10 + -1;
  }
  return;
}

Assistant:

static void
float_to_s24(void * ptr, long nsamp, float volume)
{
  int32_t * dst = ptr;
  float * src = ptr;
  float mult = volume * 8388608;
  int s;

  while (nsamp-- > 0) {
    s = lrintf(*(src++) * mult);
    if (s < -8388608)
      s = -8388608;
    else if (s > 8388607)
      s = 8388607;
    *(dst++) = s;
  }
}